

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsCore.c
# Opt level: O0

void Abc_NtkMfsParsDefault(Mfs_Par_t *pPars)

{
  Mfs_Par_t *pPars_local;
  
  memset(pPars,0,0x44);
  pPars->nWinTfoLevs = 2;
  pPars->nFanoutsMax = 0x1e;
  pPars->nDepthMax = 0x14;
  pPars->nWinMax = 300;
  pPars->nGrowthLevel = 0;
  pPars->nBTLimit = 5000;
  pPars->fRrOnly = 0;
  pPars->fResub = 1;
  pPars->fArea = 0;
  pPars->fMoreEffort = 0;
  pPars->fSwapEdge = 0;
  pPars->fOneHotness = 0;
  pPars->fVerbose = 0;
  pPars->fVeryVerbose = 0;
  return;
}

Assistant:

void Abc_NtkMfsParsDefault( Mfs_Par_t * pPars )
{
    memset( pPars, 0, sizeof(Mfs_Par_t) );
    pPars->nWinTfoLevs  =    2;
    pPars->nFanoutsMax  =   30;
    pPars->nDepthMax    =   20;
    pPars->nWinMax      =  300;
    pPars->nGrowthLevel =    0;
    pPars->nBTLimit     = 5000;
    pPars->fRrOnly      =    0;
    pPars->fResub       =    1;
    pPars->fArea        =    0;
    pPars->fMoreEffort  =    0;
    pPars->fSwapEdge    =    0;
    pPars->fOneHotness  =    0;
    pPars->fVerbose     =    0;
    pPars->fVeryVerbose =    0;
}